

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

bool __thiscall ON_3dVector::operator>=(ON_3dVector *this,ON_3dVector *v)

{
  byte local_24;
  bool local_23;
  byte local_22;
  byte local_21;
  ON_3dVector *v_local;
  ON_3dVector *this_local;
  
  if (this->x < v->x || this->x == v->x) {
    if ((this->x != v->x) || (NAN(this->x) || NAN(v->x))) {
      local_24 = 0;
    }
    else {
      if (this->y < v->y || this->y == v->y) {
        local_23 = false;
        if ((this->y == v->y) && (!NAN(this->y) && !NAN(v->y))) {
          local_23 = v->z <= this->z;
        }
        local_22 = -local_23;
      }
      else {
        local_22 = 1;
      }
      local_24 = local_22;
    }
    local_21 = local_24;
  }
  else {
    local_21 = 1;
  }
  return (bool)(local_21 & 1);
}

Assistant:

bool ON_3dVector::operator>=( const ON_3dVector& v ) const
{
  // dictionary order
  return ((x>v.x)?true:((x==v.x)?((y>v.y)?true:(y==v.y&&z>=v.z)?true:false):false));
}